

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void __thiscall FFT::FFTExecutor::_cleanPlans(FFTExecutor *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    free(*(void **)(in_RDI + 0x10));
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  if (*(long *)(in_RDI + 0x18) != 0) {
    free(*(void **)(in_RDI + 0x18));
    *(undefined8 *)(in_RDI + 0x18) = 0;
  }
  return;
}

Assistant:

void FFTExecutor::_cleanPlans()
    {
        if ( _planDirect != 0 ) {
            kiss_fft_free( _planDirect );

            _planDirect = 0;
        }

        if ( _planInverse != 0 ) {
            kiss_fft_free( _planInverse );

            _planInverse = 0;
        }
    }